

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

HRESULT __thiscall
Js::RecyclableObject::QueryObjectInterface(RecyclableObject *this,IID *riid,void **ppvObj)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((((((this->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
      ptr)->threadContext->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x14a,
                                "(!this->GetScriptContext()->GetThreadContext()->IsScriptActive())",
                                "!this->GetScriptContext()->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return -0x7fffbffe;
}

Assistant:

HRESULT RecyclableObject::QueryObjectInterface(REFIID riid, void **ppvObj)
    {
        Assert(!this->GetScriptContext()->GetThreadContext()->IsScriptActive());
        return E_NOINTERFACE;
    }